

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

string_view __thiscall inja::Lexer::clear_final_line_if_whitespace(Lexer *this,string_view text)

{
  byte bVar1;
  undefined1 auVar2 [16];
  Lexer *pLVar3;
  char *pcVar4;
  string_view sVar5;
  
  pcVar4 = (char *)text._M_len;
  pLVar3 = this;
  if (this != (Lexer *)0x0) {
    do {
      bVar1 = (pcVar4 + -1)[(long)pLVar3];
      if (bVar1 < 0xd) {
        if (bVar1 != 9) {
          if (bVar1 != 10) goto LAB_0010dd78;
LAB_0010dd75:
          this = pLVar3;
LAB_0010dd78:
          sVar5._M_str = pcVar4;
          sVar5._M_len = (size_t)this;
          return sVar5;
        }
      }
      else if (bVar1 != 0x20) {
        if (bVar1 != 0xd) goto LAB_0010dd78;
        goto LAB_0010dd75;
      }
      pLVar3 = (Lexer *)((long)&pLVar3[-1].m_pos + 7);
    } while (pLVar3 != (Lexer *)0x0);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = pcVar4;
  return (string_view)(auVar2 << 0x40);
}

Assistant:

static nonstd::string_view clear_final_line_if_whitespace(nonstd::string_view text)
  {
    nonstd::string_view result = text;
    while (!result.empty()) {
      char ch = result.back();
      if (ch == ' ' || ch == '\t')
       result.remove_suffix(1);
      else if (ch == '\n' || ch == '\r')
        break;
      else
        return text;
    }
    return result;
  }